

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void __thiscall DWallLightTransfer::Serialize(DWallLightTransfer *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = ::Serialize(arc,"lastlight",&this->LastLight,(int16_t *)0x0);
  pFVar1 = Serialize<sector_t>(pFVar1,"source",(sector_t_conflict **)&this->Source,
                               (sector_t_conflict **)0x0);
  pFVar1 = ::Serialize(pFVar1,"targetid",&this->TargetID,(int32_t *)0x0);
  ::Serialize(pFVar1,"flags",&this->Flags,(uint8_t *)0x0);
  return;
}

Assistant:

void DWallLightTransfer::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("lastlight", LastLight)
		("source", Source)
		("targetid", TargetID)
		("flags", Flags);
}